

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

void CP_verbose(SstStream s,VerbosityLevel Level,char *Format,...)

{
  int iVar1;
  char in_AL;
  undefined8 in_RCX;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list Args;
  undefined8 local_d8;
  void **local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if (s->CPVerbosityLevel < (int)Level) {
    return;
  }
  local_c8 = local_b8;
  local_d0 = &Args[0].overflow_arg_area;
  local_d8 = 0x3000000018;
  pcVar2 = "Writer";
  if (s->Role == ReaderRole) {
    pcVar2 = "Reader";
  }
  iVar1 = s->CPVerbosityLevel;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (1 < iVar1 - 4U) {
    if (iVar1 == 3) {
      fprintf(_stderr,"%s (%p): ",pcVar2,s);
      goto LAB_00113532;
    }
    if (iVar1 != 1) goto LAB_00113532;
  }
  fprintf(_stderr,"%s %d (%p): ",pcVar2,(ulong)(uint)s->Rank,s);
LAB_00113532:
  vfprintf(_stderr,Format,&local_d8);
  return;
}

Assistant:

extern void CP_verbose(SstStream s, enum VerbosityLevel Level, char *Format, ...)
{
    if (s->CPVerbosityLevel >= (int)Level)
    {
        va_list Args;
        va_start(Args, Format);
        char *Role = "Writer";
        if (s->Role == ReaderRole)
        {
            Role = "Reader";
        }
        switch (s->CPVerbosityLevel)
        {
        case TraceVerbose:
        case PerRankVerbose:
        case CriticalVerbose:
            fprintf(stderr, "%s %d (%p): ", Role, s->Rank, s);
            break;
        case PerStepVerbose:
            fprintf(stderr, "%s (%p): ", Role, s);
            break;
        case SummaryVerbose:
        default:
            break;
        }
        vfprintf(stderr, Format, Args);
        va_end(Args);
    }
}